

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O3

void __thiscall CDirectiveFile::initOpen(CDirectiveFile *this,path *fileName,int64_t memory)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  FileManager *this_01;
  GenericAssemblerFile *pGVar1;
  GenericAssemblerFile *__tmp;
  path fullName;
  bool local_6a;
  undefined1 local_69;
  GenericAssemblerFile *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  shared_ptr<AssemblerFile> local_50;
  int64_t local_40;
  path local_38;
  
  *(undefined4 *)&(this->super_CAssemblerCommand).field_0x14 = 1;
  local_40 = memory;
  getFullPathName(&local_38,fileName);
  local_6a = false;
  local_68 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<GenericAssemblerFile,std::allocator<GenericAssemblerFile>,ghc::filesystem::path&,long&,bool>
            (a_Stack_60,&local_68,(allocator<GenericAssemblerFile> *)&local_69,&local_38,&local_40,
             &local_6a);
  local_50.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_60[0]._M_pi;
  pGVar1 = local_68;
  local_68 = (GenericAssemblerFile *)0x0;
  a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pGVar1;
  this_00 = (this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_50.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
    }
    local_50.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
  }
  this_01 = g_fileManager;
  local_50.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->file).super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_AssemblerFile;
  if (local_50.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_50.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_50.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  FileManager::addFile(this_01,&local_50);
  if (local_50.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  Global.Section = Global.Section + 1;
  (this->super_CAssemblerCommand).section = Global.Section;
  ghc::filesystem::path::~path(&local_38);
  return;
}

Assistant:

void CDirectiveFile::initOpen(const fs::path& fileName, int64_t memory)
{
	type = Type::Open;
	fs::path fullName = getFullPathName(fileName);

	file = std::make_shared<GenericAssemblerFile>(fullName,memory,false);
	g_fileManager->addFile(file);

	updateSection(++Global.Section);
}